

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnklog.cpp
# Opt level: O0

void gnilk::Logger::DisableAllSinks(void)

{
  LogManager *this;
  anon_class_1_0_00000001 local_29;
  SinkDelegate local_28;
  
  this = LogManager::Instance();
  std::function<bool(gnilk::LogSink*)>::function<gnilk::Logger::DisableAllSinks()::__0,void>
            ((function<bool(gnilk::LogSink*)> *)&local_28,&local_29);
  LogManager::IterateSinks(this,&local_28);
  std::function<bool_(gnilk::LogSink_*)>::~function(&local_28);
  return;
}

Assistant:

void Logger::DisableAllSinks() {
    LogManager::Instance().IterateSinks([](LogSink *sink) {
        sink->SetEnabled(false);
        return true;
    });
}